

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream_p.h
# Opt level: O0

QStringView __thiscall QXmlStreamReaderPrivate::symView(QXmlStreamReaderPrivate *this,int index)

{
  Value *n;
  int in_ESI;
  QXmlStreamReaderPrivate *in_RDI;
  long in_FS_OFFSET;
  QStringView QVar1;
  Value *symbol;
  QStringView *in_stack_ffffffffffffffb0;
  QStringView *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  QChar local_18 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  n = sym(in_RDI,in_ESI);
  QString::data((QString *)in_RDI);
  QStringView::QStringView<QChar,_true>(in_stack_ffffffffffffffb0,local_18,(qsizetype)in_RDI);
  QVar1 = QStringView::mid(in_stack_ffffffffffffffb8,CONCAT44(in_ESI,in_stack_ffffffffffffffc8),
                           (qsizetype)n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return QVar1;
  }
  __stack_chk_fail();
}

Assistant:

QStringView symView(int index) const
    {
        const Value &symbol = sym(index);
        return QStringView(textBuffer.data() + symbol.pos, symbol.len).mid(symbol.prefix);
    }